

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<unsigned_int,char[9],__va_list_tag[1]>
          (Capturer *this,size_t index,uint *value,char (*values) [9],__va_list_tag (*values_1) [1])

{
  string local_50;
  __va_list_tag (*local_30) [1];
  __va_list_tag (*values_local_1) [1];
  char (*values_local) [9];
  uint *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = (__va_list_tag (*) [1])values;
  values_local = (char (*) [9])value;
  value_local = (uint *)index;
  index_local = (size_t)this;
  Detail::stringify<unsigned_int>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<char[9],__va_list_tag[1]>
            (this,(long)value_local + 1,(char (*) [9])values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }